

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_specification.hpp
# Opt level: O2

void chaiscript::detail::Exception_Handler_Base::throw_type<std::exception_const&>
               (Boxed_Value *bv,Dispatch_Engine *t_engine)

{
  undefined8 *puVar1;
  
  Dispatch_Engine::boxed_cast<std::exception_const&>(t_engine,bv);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = std::istream::_M_extract<long_double>;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void throw_type(const Boxed_Value &bv, const Dispatch_Engine &t_engine) {
        try {
          T t = t_engine.boxed_cast<T>(bv);
          throw t;
        } catch (const chaiscript::exception::bad_boxed_cast &) {
        }
      }